

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  uint uVar1;
  uint uVar2;
  Node *block;
  int iVar3;
  undefined4 uVar4;
  TValue *pTVar5;
  int *piVar6;
  TValue *pTVar7;
  ulong key;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar1 = t->sizearray;
  uVar8 = (ulong)uVar1;
  if (t->lastfree == (Node *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (uVar1 < nasize) {
    pTVar5 = (TValue *)luaM_realloc_(L,t->array,uVar8 << 4,(ulong)nasize << 4);
    t->array = pTVar5;
    uVar2 = t->sizearray;
    if (uVar2 < nasize) {
      lVar9 = (ulong)nasize - (ulong)uVar2;
      piVar6 = &pTVar5[uVar2].tt_;
      do {
        *piVar6 = 0;
        piVar6 = piVar6 + 4;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    t->sizearray = nasize;
  }
  setnodevector(L,t,nhsize);
  if (nasize < uVar1) {
    t->sizearray = nasize;
    uVar11 = (ulong)nasize;
    lVar9 = uVar11 << 4;
    key = uVar11;
    do {
      key = key + 1;
      if (*(int *)((long)&t->array->tt_ + lVar9) != 0) {
        luaH_setint(L,t,key,(TValue *)((long)&t->array->value_ + lVar9));
      }
      lVar9 = lVar9 + 0x10;
    } while (key != uVar8);
    pTVar5 = (TValue *)luaM_realloc_(L,t->array,uVar8 << 4,uVar11 << 4);
    t->array = pTVar5;
  }
  uVar8 = (ulong)uVar10;
  if (0 < (int)uVar10) {
    lVar9 = uVar8 + 1;
    pTVar5 = (TValue *)&block[uVar8 - 1].i_key;
    do {
      if (pTVar5[-1].tt_ != 0) {
        pTVar7 = luaH_set(L,t,pTVar5);
        iVar3 = pTVar5[-1].tt_;
        uVar4 = *(undefined4 *)&pTVar5[-1].field_0xc;
        pTVar7->value_ = pTVar5[-1].value_;
        pTVar7->tt_ = iVar3;
        *(undefined4 *)&pTVar7->field_0xc = uVar4;
      }
      lVar9 = lVar9 + -1;
      pTVar5 = pTVar5 + -2;
    } while (1 < lVar9);
  }
  if (0 < (int)uVar10) {
    luaM_realloc_(L,block,uVar8 << 5,0);
    return;
  }
  return;
}

Assistant:

void luaH_resize(lua_State *L, Table *t, unsigned int nasize,
                 unsigned int nhsize) {
    unsigned int i;
    int j;
    unsigned int oldasize = t->sizearray;
    int oldhsize = allocsizenode(t);
    Node *nold = t->node;  /* save old hash ... */
    if (nasize > oldasize)  /* array part must grow? */
        setarrayvector(L, t, nasize);
    /* create new hash part with appropriate size */
    setnodevector(L, t, nhsize);
    if (nasize < oldasize) {  /* array part must shrink? */
        t->sizearray = nasize;
        /* re-insert elements from vanishing slice */
        for (i = nasize; i < oldasize; i++) {
            if (!ttisnil(&t->array[i]))
                luaH_setint(L, t, i + 1, &t->array[i]);
        }
        /* shrink array */
        luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
    }
    /* re-insert elements from hash part */
    for (j = oldhsize - 1; j >= 0; j--) {
        Node *old = nold + j;
        if (!ttisnil(gval(old))) {
            /* doesn't need barrier/invalidate cache, as entry was
               already present in the table */
            setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
        }
    }
    if (oldhsize > 0)  /* not the dummy node? */
        luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}